

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

basic_appender<char>
fmt::v11::detail::
write_significand<fmt::v11::basic_appender<char>,char,unsigned_long,fmt::v11::detail::digit_grouping<char>>
          (basic_appender<char> out,unsigned_long significand,int significand_size,int integral_size
          ,char decimal_point,digit_grouping<char> *grouping)

{
  bool bVar1;
  make_unsigned_t<int> mVar2;
  char *pcVar3;
  basic_appender<char> out_00;
  int in_ECX;
  undefined8 in_RDI;
  basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_> buffer;
  digit_grouping<char> *in_stack_000005c0;
  basic_string_view<char> in_stack_000005c8;
  basic_appender<char> in_stack_000005d8;
  allocator<char> *in_stack_fffffffffffffd18;
  basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_> *in_stack_fffffffffffffd20;
  buffer<char> *this;
  undefined8 in_stack_fffffffffffffd30;
  char decimal_point_00;
  undefined8 in_stack_fffffffffffffd38;
  unsigned_long in_stack_fffffffffffffd40;
  basic_appender<char> in_stack_fffffffffffffd48;
  basic_string_view<char> local_290;
  undefined8 local_280;
  buffer<char> *local_278;
  basic_appender<char> local_260 [2];
  buffer<char> local_250 [16];
  undefined8 local_38;
  int local_20;
  undefined8 local_10;
  buffer<char> *local_8;
  
  decimal_point_00 = (char)((ulong)in_stack_fffffffffffffd30 >> 0x38);
  local_20 = in_ECX;
  local_10 = in_RDI;
  bVar1 = digit_grouping<char>::has_separator((digit_grouping<char> *)0x137ab4);
  if (bVar1) {
    basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::basic_memory_buffer
              (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    basic_appender<char>::basic_appender(local_260,local_250);
    local_278 = (buffer<char> *)
                write_significand<fmt::v11::basic_appender<char>,_unsigned_long,_char,_0>
                          (in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,
                           (int)((ulong)in_stack_fffffffffffffd38 >> 0x20),
                           (int)in_stack_fffffffffffffd38,decimal_point_00);
    local_280 = local_10;
    pcVar3 = buffer<char>::data(local_250);
    mVar2 = to_unsigned<int>(0);
    basic_string_view<char>::basic_string_view(&local_290,pcVar3,(ulong)mVar2);
    digit_grouping<char>::apply<fmt::v11::basic_appender<char>,char>
              (in_stack_000005c0,in_stack_000005d8,in_stack_000005c8);
    this = local_250;
    pcVar3 = buffer<char>::data(this);
    out_00.container = (buffer<char> *)(pcVar3 + local_20);
    buffer<char>::end(this);
    local_8 = (buffer<char> *)
              copy_noinline<char,char*,fmt::v11::basic_appender<char>>
                        ((char *)this,(char *)in_stack_fffffffffffffd18,out_00);
    basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::~basic_memory_buffer
              ((basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_> *)0x137c4f);
  }
  else {
    local_38 = local_10;
    local_8 = (buffer<char> *)
              write_significand<fmt::v11::basic_appender<char>,_unsigned_long,_char,_0>
                        (in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,
                         (int)((ulong)in_stack_fffffffffffffd38 >> 0x20),
                         (int)in_stack_fffffffffffffd38,decimal_point_00);
  }
  return (basic_appender<char>)local_8;
}

Assistant:

FMT_CONSTEXPR20 auto write_significand(OutputIt out, T significand,
                                       int significand_size, int integral_size,
                                       Char decimal_point,
                                       const Grouping& grouping) -> OutputIt {
  if (!grouping.has_separator()) {
    return write_significand(out, significand, significand_size, integral_size,
                             decimal_point);
  }
  auto buffer = basic_memory_buffer<Char>();
  write_significand(basic_appender<Char>(buffer), significand, significand_size,
                    integral_size, decimal_point);
  grouping.apply(
      out, basic_string_view<Char>(buffer.data(), to_unsigned(integral_size)));
  return detail::copy_noinline<Char>(buffer.data() + integral_size,
                                     buffer.end(), out);
}